

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_attributes_uint8(void *a,uint8_t **attrib)

{
  uint32_t uVar1;
  ssize_t sVar2;
  char *source;
  int iVar3;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  
  iVar3 = 0;
  if (*(int *)((long)a + 0x24) == 0x11) {
    sVar2 = read((int)&nr_of_attribs,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      iVar3 = 0;
    }
    else {
      sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      iVar3 = 0;
      if ((int)sVar2 != 0) {
        source = (char *)malloc((ulong)nr_of_compressed_bytes);
        sVar2 = read((int)source,(void *)0x1,(ulong)nr_of_compressed_bytes);
        iVar3 = 0;
        if ((int)sVar2 != 0) {
          if (attrib != (uint8_t **)0x0) {
            uVar1 = LZ4_decompress_safe(source,(char *)attrib,nr_of_compressed_bytes,nr_of_attribs);
            if (uVar1 != nr_of_attribs) {
              __assert_fail("bytes_decompressed == nr_of_attribs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x5a0,"int trico_read_attributes_uint8(void *, uint8_t **)");
            }
          }
          free(source);
          read_next_stream_type((trico_archive *)a);
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int trico_read_attributes_uint8(void* a, uint8_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint8_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;

  if (attrib != NULL)
    {
    uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)attrib, nr_of_compressed_bytes, nr_of_attribs);
    assert(bytes_decompressed == nr_of_attribs);
    (void)bytes_decompressed; //suppress warning
    }

  trico_free(compressed);  

  read_next_stream_type(arch);

  return 1;
  }